

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

TGet * __thiscall
MultiAgentDecisionProcessDiscrete::GetTGet(MultiAgentDecisionProcessDiscrete *this)

{
  TGet_TransitionModelMappingSparse *in_RDI;
  TransitionModelMappingSparse *in_stack_ffffffffffffffe8;
  TGet *local_8;
  
  if (((ulong)in_RDI[0xf].super_TGet._vptr_TGet & 0x100) == 0) {
    local_8 = (TGet *)operator_new(0x20);
    TGet_TransitionModelMapping::TGet_TransitionModelMapping
              ((TGet_TransitionModelMapping *)in_RDI,
               (TransitionModelMapping *)in_stack_ffffffffffffffe8);
  }
  else {
    local_8 = (TGet *)operator_new(0x20);
    TGet_TransitionModelMappingSparse::TGet_TransitionModelMappingSparse
              (in_RDI,in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

TGet* MultiAgentDecisionProcessDiscrete::GetTGet() const
{ 
    if(_m_sparse)
        return new TGet_TransitionModelMappingSparse(
                ((TransitionModelMappingSparse*)_m_p_tModel)  ); 
    else
        return new TGet_TransitionModelMapping(
                ((TransitionModelMapping*)_m_p_tModel)  );
}